

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
pegmatite::AsciiFileInput::AsciiFileInput(AsciiFileInput *this,int file,string *name)

{
  int iVar1;
  undefined1 local_b0 [8];
  stat buf;
  string *name_local;
  int file_local;
  AsciiFileInput *this_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)name;
  Input::Input(&this->super_Input,name);
  (this->super_Input)._vptr_Input = (_func_int **)&PTR_fillBuffer_0022eab0;
  this->fd = file;
  iVar1 = fstat(this->fd,(stat *)local_b0);
  if (iVar1 == 0) {
    this->file_size = buf.st_rdev;
  }
  else {
    this->file_size = 0;
    perror("Input error");
  }
  return;
}

Assistant:

AsciiFileInput::AsciiFileInput(int file, const std::string& name)
	: Input(name), fd(file)
{
	struct stat buf;
	if (fstat(fd, &buf) != 0)
	{
		file_size = 0;
		perror("Input error");
	}
	else
	{
		file_size = static_cast<Index>(buf.st_size);
	}
}